

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O3

Size_t __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)0>::Move_iterator::find_next
          (Move_iterator *this,Size_t from)

{
  pthread_mutex_t *__mutex;
  pointer puVar1;
  long lVar2;
  int iVar3;
  Size_t SVar4;
  Size_t SVar5;
  
  __mutex = (pthread_mutex_t *)this->mtx_;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  puVar1 = (this->events_->
           super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  SVar4 = (long)(this->events_->
                super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (SVar4 != from) {
    SVar5 = from;
    do {
      from = SVar4;
      if (SVar4 - 1 == SVar5) break;
      from = SVar5 + 1;
      lVar2 = SVar5 + 1;
      SVar5 = from;
    } while ((_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
             puVar1[lVar2]._M_t.
             super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t ==
             (_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)0x0);
  }
  pthread_mutex_unlock(__mutex);
  return from;
}

Assistant:

auto find_next(Size_t from) -> Size_t
            {
                Guard_t g{mtx_};
                const auto end = events_.size();
                if (from == end)
                    return from;
                while (++from != end && events_[from] == nullptr) {}
                return from;
            }